

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::DisableIffSyntax::setChild(DisableIffSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0048ce0c + *(int *)(&DAT_0048ce0c + index * 4)))();
  return;
}

Assistant:

void DisableIffSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: disable = child.token(); return;
        case 1: iff = child.token(); return;
        case 2: openParen = child.token(); return;
        case 3: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 4: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}